

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<4,_6,_6>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float fVar1;
  int r;
  long lVar2;
  int in_ECX;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar3;
  undefined4 in_register_00000014;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar4;
  Matrix<float,_3,_2> retVal;
  Type in1;
  Type in0;
  Matrix<float,_3,_2> local_84;
  Mat2x3 local_6c;
  Mat2x3 local_54;
  MatrixCaseUtils local_3c [12];
  VecAccess<float,_4,_3> local_30;
  
  if (in0Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,6>
              (&local_54,(MatrixCaseUtils *)evalCtx,
               (ShaderEvalContext *)CONCAT44(in_register_00000014,in1Type),in_ECX);
    uVar3 = extraout_EDX;
    uVar4 = extraout_var;
  }
  else {
    tcu::Matrix<float,_3,_2>::Matrix(&local_54,(float *)sr::(anonymous_namespace)::s_constInMat2x3);
    uVar3 = extraout_EDX_00;
    uVar4 = extraout_var_00;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    sr::(anonymous_namespace)::MatrixCaseUtils::getInputValue<2,6>
              (&local_6c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)CONCAT44(uVar4,uVar3),
               in_ECX);
  }
  else {
    tcu::Matrix<float,_3,_2>::Matrix
              (&local_6c,(float *)(sr::(anonymous_namespace)::s_constInMat2x3 + 0x18));
  }
  tcu::Matrix<float,_3,_2>::Matrix(&local_84);
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    fVar1 = local_54.m_data.m_data[1].m_data[lVar2];
    local_84.m_data.m_data[0].m_data[lVar2] =
         local_54.m_data.m_data[0].m_data[lVar2] * local_6c.m_data.m_data[0].m_data[lVar2];
    local_84.m_data.m_data[1].m_data[lVar2] = fVar1 * local_6c.m_data.m_data[1].m_data[lVar2];
  }
  reduceToVec3(local_3c,&local_84);
  local_30.m_vector = &evalCtx->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,(Vector<float,_3> *)local_3c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(matrixCompMult(in0, in1));
	}